

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O2

err_t bakeBSTSStep3(octet *out,octet *in,void *state)

{
  u64 *stack;
  long lVar1;
  ulong n;
  size_t count;
  size_t count_00;
  bool_t bVar2;
  int iVar3;
  u64 *dest;
  word *c;
  word wVar4;
  word *b;
  ulong n_00;
  octet *dest_00;
  u64 *header;
  err_t eVar5;
  
  bVar2 = objIsOperable(state);
  eVar5 = 0x6d;
  if (bVar2 != 0) {
    lVar1 = *(long *)(*(long *)((long)state + 0x18) + 0x18);
    n = *(ulong *)(lVar1 + 0x30);
    count = *(size_t *)(lVar1 + 0x38);
    count_00 = count * 2;
    bVar2 = memIsValid(in,count_00);
    if (bVar2 != 0) {
      bVar2 = memIsValid(out,*(long *)((long)state + 0x1d0) + count * 3 + 8);
      if (bVar2 != 0) {
        b = (word *)(*state + (long)state);
        dest = b + n * 2;
        n_00 = n >> 1;
        stack = dest + n + n_00 * 2 + 6;
        lVar1 = *(long *)(*(long *)((long)state + 0x18) + 0x18);
        iVar3 = (**(code **)(lVar1 + 0x40))(*(undefined8 *)((long)state + 0x38),in,lVar1,stack);
        eVar5 = 0x191;
        if (iVar3 != 0) {
          lVar1 = *(long *)(*(long *)((long)state + 0x18) + 0x18);
          iVar3 = (**(code **)(lVar1 + 0x40))
                            (n * 8 + *(long *)((long)state + 0x38),in + count,lVar1,stack);
          if (iVar3 != 0) {
            bVar2 = ecpIsOnA(*(word **)((long)state + 0x38),*(ec_o **)((long)state + 0x18),stack);
            if (bVar2 != 0) {
              bVar2 = zzRandNZMod(*(word **)((long)state + 0x28),
                                  *(word **)(*(long *)((long)state + 0x18) + 0x38),n,
                                  *(gen_i *)((long)state + 0x1b8),*(void **)((long)state + 0x1c0));
              if (bVar2 == 0) {
                eVar5 = 0x130;
              }
              else {
                bVar2 = ecMulA(b,(*(ec_o **)((long)state + 0x18))->base,
                               *(ec_o **)((long)state + 0x18),*(word **)((long)state + 0x28),n,stack
                              );
                eVar5 = 0x1f6;
                if (bVar2 != 0) {
                  c = dest + n_00 + 1;
                  lVar1 = *(long *)(*(long *)((long)state + 0x18) + 0x18);
                  (**(code **)(lVar1 + 0x48))(b,b,lVar1,stack);
                  lVar1 = *(long *)(*(long *)((long)state + 0x18) + 0x18);
                  (**(code **)(lVar1 + 0x48))((long)b + count,b + n,lVar1,stack);
                  beltHashStart(stack);
                  beltHashStepH(b,count,stack);
                  beltHashStepH(in,count,stack);
                  beltHashStepG2((octet *)dest,count >> 1,stack);
                  u64From(dest,dest,count >> 1);
                  memCopy(out,b,count_00);
                  zzMul(c,dest,n_00,*(word **)((long)state + 0x20),n,stack);
                  wVar4 = zzAdd2(c + n_00,*(word **)((long)state + 0x20),n);
                  c[n_00 + n] = wVar4;
                  zzMod(c,c,n_00 + n + 1,*(word **)(*(long *)((long)state + 0x18) + 0x38),n,stack);
                  zzSubMod(c,*(word **)((long)state + 0x28),c,
                           *(word **)(*(long *)((long)state + 0x18) + 0x38),n);
                  dest_00 = out + count_00;
                  u64To(dest_00,count,c);
                  memCopy(out + count * 3,*(void **)((long)state + 0x1c8),
                          *(size_t *)((long)state + 0x1d0));
                  bVar2 = ecMulA(b,*(word **)((long)state + 0x38),*(ec_o **)((long)state + 0x18),
                                 *(word **)((long)state + 0x28),n,stack);
                  if (bVar2 != 0) {
                    lVar1 = *(long *)(*(long *)((long)state + 0x18) + 0x18);
                    (**(code **)(lVar1 + 0x48))(b,b,lVar1,stack);
                    beltHashStart(stack);
                    beltHashStepH(b,count,stack);
                    if (*(void **)((long)state + 0x198) != (void *)0x0) {
                      beltHashStepH(*(void **)((long)state + 0x198),*(size_t *)((long)state + 0x1a0)
                                    ,stack);
                    }
                    header = dest + n + n_00 * 2 + 2;
                    if (*(void **)((long)state + 0x1a8) != (void *)0x0) {
                      beltHashStepH(*(void **)((long)state + 0x1a8),*(size_t *)((long)state + 0x1b0)
                                    ,stack);
                    }
                    beltHashStepG((octet *)b,stack);
                    eVar5 = 0;
                    memSet(header,'\0',0x10);
                    memSet(dest + n + n_00 * 2 + 4,0xff,0x10);
                    beltKRPStart(stack,(octet *)b,0x20,(octet *)(dest + n + n_00 * 2 + 4));
                    beltKRPStepG((octet *)((long)state + 0x1e0),0x20,(octet *)header,stack);
                    *(undefined1 *)header = 1;
                    beltKRPStepG((octet *)((long)state + 0x200),0x20,(octet *)header,stack);
                    *(undefined1 *)header = 2;
                    beltKRPStepG((octet *)((long)state + 0x220),0x20,(octet *)header,stack);
                    *(undefined1 *)header = 0;
                    beltCFBStart(stack,(octet *)((long)state + 0x220),0x20,(octet *)header);
                    beltCFBStepE(dest_00,*(long *)((long)state + 0x1d0) + count,stack);
                    beltMACStart(stack,(octet *)((long)state + 0x200),0x20);
                    beltMACStepA(dest_00,count + *(long *)((long)state + 0x1d0),stack);
                    beltMACStepA(header,0x10,stack);
                    beltMACStepG(out + count * 3 + *(long *)((long)state + 0x1d0),stack);
                    wwCopy(*(word **)((long)state + 0x30),dest,n_00);
                    *(undefined8 *)(*(long *)((long)state + 0x30) + n_00 * 8) = 1;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return eVar5;
}

Assistant:

err_t bakeBSTSStep3(octet out[], const octet in[], void* state)
{
	bake_bsts_o* s = (bake_bsts_o*)state;
	size_t n, no;
	// стек
	word* Va;			/* [2 * n] */
	word* t;			/* [n / 2 + 1] */
	word* sa;			/* [n + n / 2 + 1] */
	octet* K;			/* [no] (совпадает с Va) */
	octet* block0;		/* [16] (следует за sa) */
	octet* block1;		/* [16] (следует за block0) */
	void* stack;
	// проверить входные данные
	if (!objIsOperable(s))
		return ERR_BAD_INPUT;
	n = s->ec->f->n, no = s->ec->f->no;
	if (!memIsValid(in, 2 * no) ||
		!memIsValid(out, 3 * no + s->cert->len + 8))
		return ERR_BAD_INPUT;
	ASSERT(memIsDisjoint2(out, 3 * no + s->cert->len + 8, s, objKeep(s)));
	// раскладка стека
	Va = objEnd(s, word);
	t = Va + 2 * n;
	sa = t + n / 2 + 1;
	K = (octet*)Va;
	block0 = (octet*)(sa + n + n / 2 + 1);
	block1 = block0 + 16;
	stack = block1 + 16;
	// Vb <- in, Vb \in E*?
	if (!qrFrom(ecX(s->Vb), in, s->ec->f, stack) ||
		!qrFrom(ecY(s->Vb, n), in + no, s->ec->f, stack) ||
		!ecpIsOnA(s->Vb, s->ec, stack))
		return ERR_BAD_POINT;
	// ua <-R {1, 2, ..., q - 1}
	if (!zzRandNZMod(s->u, s->ec->order, n, s->settings->rng,
		s->settings->rng_state))
		return ERR_BAD_RNG;
	// Va <- ua G
	if (!ecMulA(Va, s->ec->base, s->ec, s->u, n, stack))
		return ERR_BAD_PARAMS;
	qrTo((octet*)Va, ecX(Va), s->ec->f, stack);
	qrTo((octet*)Va + no, ecY(Va, n), s->ec->f, stack);
	// t <- <beltHash(<Va>_2l || <Vb>_2l)>_l
	beltHashStart(stack);
	beltHashStepH(Va, no, stack);
	beltHashStepH(in, no, stack);
	beltHashStepG2((octet*)t, no / 2, stack);
	wwFrom(t, t, no / 2);
	// out ||.. <- <Va>_4l
	memCopy(out, Va, 2 * no);
	// sa <- (ua - (2^l + t)da) \mod q
	zzMul(sa, t, n / 2, s->d, n, stack);
	sa[n + n / 2] = zzAdd2(sa + n / 2, s->d, n);
	zzMod(sa, sa, n + n / 2 + 1, s->ec->order, n, stack);
	zzSubMod(sa, s->u, sa, s->ec->order, n);
	// ..|| out ||.. <- sa || certa
	wwTo(out + 2 * no, no, sa);
	memCopy(out + 3 * no, s->cert->data, s->cert->len);
	// K <- beltHash(<ua Vb>_2l || helloa || hellob)
	if (!ecMulA(Va, s->Vb, s->ec, s->u, n, stack))
		return ERR_BAD_PARAMS;
	qrTo(K, ecX(Va), s->ec->f, stack);
	beltHashStart(stack);
	beltHashStepH(K, no, stack);
	if (s->settings->helloa)
		beltHashStepH(s->settings->helloa, s->settings->helloa_len, stack);
	if (s->settings->hellob)
		beltHashStepH(s->settings->hellob, s->settings->hellob_len, stack);
	beltHashStepG(K, stack);
	// K0 <- beltKRP(K, 1^96, 0)
	memSetZero(block0, 16);
	memSet(block1, 0xFF, 16);
	beltKRPStart(stack, K, 32, block1);
	beltKRPStepG(s->K0, 32, block0, stack);
	// K1 <- beltKRP(K, 1^96, 1)
	block0[0] = 1;
	beltKRPStepG(s->K1, 32, block0, stack);
	// K2 <- beltKRP(K, 1^96, 2)
	block0[0] = 2;
	beltKRPStepG(s->K2, 32, block0, stack);
	// ..|| out ||.. <- beltCFBEncr(sa || certa)
	block0[0] = 0;
	beltCFBStart(stack, s->K2, 32, block0);
	beltCFBStepE(out + 2 * no, no + s->cert->len, stack);
	// ..|| out <- beltMAC(beltCFBEncr(sa || certa) || 0^128)
	beltMACStart(stack, s->K1, 32);
	beltMACStepA(out + 2 * no, no + s->cert->len, stack);
	beltMACStepA(block0, 16, stack);
	beltMACStepG(out + 3 * no + s->cert->len, stack);
	// сохранить t
	wwCopy(s->t, t, n / 2);
	s->t[n / 2] = 1;
	// все нормально
	return ERR_OK;
}